

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeYield(ExpressionContext *ctx,SynYield *syntax)

{
  FunctionData *function;
  bool bVar1;
  int iVar2;
  ScopeData *curr;
  ExprBase *pEVar3;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  TypeFunction *pTVar5;
  TypeBase *pTVar6;
  undefined4 extraout_var_00;
  ExprBase *pEVar8;
  SynBase *pSVar9;
  ScopeData *pSVar10;
  undefined4 extraout_var_01;
  _func_int **pp_Var11;
  TypeError *pTVar12;
  undefined4 extraout_var_03;
  char *msg;
  uint state;
  ExprBase *pEVar7;
  undefined4 extraout_var_02;
  
  if (syntax->value == (SynBase *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar3 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar4 = ctx->typeVoid;
    pEVar3->typeID = 2;
    pEVar3->source = &syntax->super_SynBase;
    pEVar3->type = pTVar4;
    pEVar3->next = (ExprBase *)0x0;
    pEVar3->listed = false;
    pEVar3->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
  }
  else {
    pEVar3 = AnalyzeExpression(ctx,syntax->value);
    pTVar4 = pEVar3->type;
  }
  if ((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0)) {
    pSVar10 = ctx->scope;
    while( true ) {
      if ((pSVar10 == (ScopeData *)0x0) || (pSVar10->ownerType != (TypeBase *)0x0))
      goto LAB_0016509c;
      if (pSVar10->ownerFunction != (FunctionData *)0x0) break;
      pSVar10 = pSVar10->scope;
    }
    pSVar10->ownerFunction->hasExplicitReturn = true;
LAB_0016509c:
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
    pTVar4 = pEVar3->type;
    pEVar7->typeID = 0x1d;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f98;
    pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar3;
    *(undefined8 *)&pEVar7[1].typeID = 0;
    pEVar7[1].source = (SynBase *)0x0;
    *(undefined4 *)&pEVar7[1].type = 0;
    return pEVar7;
  }
  for (pSVar10 = ctx->scope;
      (pSVar10 != (ScopeData *)0x0 && (pSVar10->ownerType == (TypeBase *)0x0));
      pSVar10 = pSVar10->scope) {
    function = pSVar10->ownerFunction;
    if (function != (FunctionData *)0x0) {
      if (function->coroutine != false) {
        pTVar4 = function->type->returnType;
        if (pTVar4 == ctx->typeAuto) {
          bVar1 = AssertValueExpression(ctx,&syntax->super_SynBase,pEVar3);
          if (!bVar1) {
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
            pTVar4 = ctx->typeVoid;
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            pp_Var11 = (_func_int **)CONCAT44(extraout_var_02,iVar2);
            pSVar9 = pEVar3->source;
            pTVar12 = ExpressionContext::GetErrorType(ctx);
            *(undefined4 *)(pp_Var11 + 1) = 0;
            pp_Var11[2] = (_func_int *)pSVar9;
            pp_Var11[3] = (_func_int *)pTVar12;
            pp_Var11[4] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var11 + 5) = 0;
            *pp_Var11 = (_func_int *)&PTR__ExprError_00223b38;
            pp_Var11[0xc] = (_func_int *)0x0;
            pp_Var11[6] = (_func_int *)(pp_Var11 + 8);
            pp_Var11[8] = (_func_int *)pEVar3;
            pp_Var11[7] = (_func_int *)0x400000002;
            pp_Var11[9] = (_func_int *)0x0;
            pEVar7->typeID = 0x1c;
            pEVar7->source = &syntax->super_SynBase;
            pEVar7->type = pTVar4;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
            pEVar7[1]._vptr_ExprBase = pp_Var11;
            *(undefined8 *)&pEVar7[1].typeID = 0;
            pEVar7[1].source = (SynBase *)0x0;
            return pEVar7;
          }
          pTVar4 = pEVar3->type;
          pTVar5 = ExpressionContext::GetFunctionType
                             (ctx,&syntax->super_SynBase,pTVar4,function->type->arguments);
          function->type = pTVar5;
        }
        pTVar6 = ctx->typeVoid;
        if ((pTVar4 == ctx->typeVoid) && (pTVar6 = pTVar4, pEVar3->type != pTVar4)) {
          anon_unknown.dwarf_9c70f::Report
                    (ctx,&syntax->super_SynBase,"ERROR: \'void\' function returning a value");
          pTVar6 = ctx->typeVoid;
        }
        if ((pTVar4 != pTVar6) && (pEVar3->type == pTVar6)) {
          anon_unknown.dwarf_9c70f::Report
                    (ctx,&syntax->super_SynBase,
                     "ERROR: function must return a value of type \'%.*s\'",
                     (ulong)(uint)(*(int *)&(pTVar4->name).end - (int)(pTVar4->name).begin));
        }
        pEVar3 = CreateCast(ctx,&syntax->super_SynBase,pEVar3,function->type->returnType,false);
        function->hasExplicitReturn = true;
        state = function->yieldCount + 1;
        function->yieldCount = state;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
        pTVar4 = ctx->typeVoid;
        pEVar8 = CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,function,state);
        pSVar9 = (SynBase *)CreateArgumentUpvalueClose(ctx,&syntax->super_SynBase,function);
        pEVar7->typeID = 0x1d;
        pEVar7->source = &syntax->super_SynBase;
        pEVar7->type = pTVar4;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f98;
        pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar3;
        *(ExprBase **)&pEVar7[1].typeID = pEVar8;
        pEVar7[1].source = pSVar9;
        *(uint *)&pEVar7[1].type = state;
        return pEVar7;
      }
      msg = "ERROR: yield can only be used inside a coroutine";
      goto LAB_0016510a;
    }
  }
  msg = "ERROR: global yield is not allowed";
LAB_0016510a:
  anon_unknown.dwarf_9c70f::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBase* AnalyzeYield(ExpressionContext &ctx, SynYield *syntax)
{
	ExprBase *result = syntax->value ? AnalyzeExpression(ctx, syntax->value) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, result->type, result, NULL, NULL, 0);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		if(!function->coroutine)
			Stop(ctx, syntax, "ERROR: yield can only be used inside a coroutine");

		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, syntax, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(syntax, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, syntax, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, syntax, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, syntax, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		unsigned yieldId = ++function->yieldCount;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, syntax, function, yieldId), CreateArgumentUpvalueClose(ctx, syntax, function), yieldId);
	}

	Stop(ctx, syntax, "ERROR: global yield is not allowed");

	return NULL;
}